

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout_open.c
# Opt level: O0

int mpt_layout_open(mpt_output *out,char *desc,char *gen)

{
  _func_ssize_t_mpt_output_ptr_size_t_void_ptr *p_Var1;
  int iVar2;
  size_t sVar3;
  ssize_t sStack_38;
  int err;
  ssize_t len;
  char *pcStack_28;
  mpt_msgtype mt;
  char *gen_local;
  char *desc_local;
  mpt_output *out_local;
  
  len._6_1_ = 0xc;
  len._7_1_ = 0x20;
  mpt_layout_open::lid = -1;
  pcStack_28 = gen;
  if (gen != (char *)0x0) {
    iVar2 = strcasecmp("file",gen);
    if (iVar2 == 0) {
      len._7_1_ = 0x20;
    }
    else {
      iVar2 = strcasecmp("lay",pcStack_28);
      if ((iVar2 == 0) || (iVar2 = strcasecmp("layout",pcStack_28), iVar2 == 0)) {
        len._7_1_ = 0x21;
      }
      else {
        iVar2 = strcasecmp("gen",pcStack_28);
        if (((iVar2 != 0) && (iVar2 = strcasecmp("generate",pcStack_28), iVar2 != 0)) &&
           (iVar2 = strcasecmp("create",pcStack_28), iVar2 != 0)) {
          return -1;
        }
        len._7_1_ = 0x22;
      }
    }
  }
  out_local._4_4_ = (*out->_vptr->await)(out,setLayout,&mpt_layout_open::lid);
  if (-1 < out_local._4_4_) {
    sStack_38 = (*out->_vptr->push)(out,2,(void *)((long)&len + 6));
    if (sStack_38 < 0) {
      out_local._4_4_ = (int)sStack_38;
    }
    else {
      if (desc != (char *)0x0) {
        p_Var1 = out->_vptr->push;
        sVar3 = strlen(desc);
        sStack_38 = (*p_Var1)(out,sVar3 + 1,desc);
      }
      if ((sStack_38 < 0) || (sStack_38 = (*out->_vptr->push)(out,0,(void *)0x0), sStack_38 < 0)) {
        (*out->_vptr->push)(out,1,(void *)0x0);
        out_local._4_4_ = (int)sStack_38;
      }
      else {
        (*out->_vptr->sync)(out,-1);
        if (mpt_layout_open::lid < 0) {
          out_local._4_4_ = 0;
        }
        else {
          out_local._4_4_ = mpt_layout_open::lid;
        }
      }
    }
  }
  return out_local._4_4_;
}

Assistant:

extern int mpt_layout_open(MPT_INTERFACE(output) *out, const char *desc, const char *gen)
{
	static int lid;
	MPT_STRUCT(msgtype) mt;
	ssize_t len;
	int err;
	
	mt.cmd = MPT_MESGTYPE(Graphic);
	mt.arg = MPT_MESGGRF(LayoutOpen);
	
	lid = -1;
	
	/* specify generator mode */
	if (gen) {
		if (!strcasecmp("file", gen)) {
			mt.arg = MPT_MESGGRF(LayoutOpen);
		}
		else if (!strcasecmp("lay", gen) || !strcasecmp("layout", gen)) {
			mt.arg = MPT_MESGGRF(LayoutParse);
		}
		else if (!strcasecmp("gen", gen) || !strcasecmp("generate", gen) || !strcasecmp("create", gen)) {
			mt.arg = MPT_MESGGRF(LayoutCreate);
		}
		else {
			return -1;
		}
	}
	/* register layout id setter */
	if ((err = out->_vptr->await(out, setLayout, &lid)) < 0) {
		return err;
	}
	/* begin open operation */
	if ((len = out->_vptr->push(out, sizeof(mt), &mt)) < 0) {
		return len;
	}
	/* add layout description/filename */
	if (desc) {
		len = out->_vptr->push(out, strlen(desc)+1, desc);
	}
	/* finish message */
	if (len < 0 || (len = out->_vptr->push(out, 0, 0)) < 0) {
		out->_vptr->push(out, 1, 0);
		return len;
	}
	/* wait for answers to queries */
	out->_vptr->sync(out, -1);
	
	/* answer not arrived within call */
	if (lid < 0) {
		return 0;
	}
	return lid;
}